

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::OptimizationBuilder<QuantLib::BFGS>::~OptimizationBuilder
          (OptimizationBuilder<QuantLib::BFGS> *this)

{
  void *in_RDI;
  
  ~OptimizationBuilder((OptimizationBuilder<QuantLib::BFGS> *)0x1f0778);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

OptimizationBuilder(const std::string& ident) :
        OptimizationCreator(ident) {}